

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformEdgeSampleCollection.h
# Opt level: O2

OrderedEdgeCollection *
GetEdgesByUniSampling(OrderedEdgeCollection *__return_storage_ptr__,CGraph *cg,long params)

{
  size_type sVar1;
  size_type sVar2;
  EdgeIdx *pEVar3;
  long *plVar4;
  size_type sVar5;
  long lVar6;
  VertexIdx VVar7;
  bool bVar8;
  reference rVar9;
  EdgeIdx e;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  uniform_int_distribution<long> unif_rand_edge;
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  size_type local_f0;
  CGraph *local_e8;
  long local_e0;
  _Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_> local_d8;
  VertexIdx local_c0;
  size_type local_b8;
  OrderedEdge local_b0;
  uniform_int_distribution<long> local_90;
  _Bvector_base<std::allocator<bool>_> local_80;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  sVar1 = cg->nVertices;
  sVar2 = cg->nEdges;
  local_e0 = *(long *)(params + 0x40);
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_ = 0;
  local_e8 = cg;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,sVar2,(bool *)&local_80,
             (allocator_type *)&local_b0);
  local_b0.u = local_b0.u & 0xffffffffffffff00;
  local_b8 = sVar1;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_80,sVar1,(bool *)&local_b0,
             (allocator_type *)&local_90);
  local_90._M_param._M_b = sVar2 - 1;
  local_90._M_param._M_a = 0;
  VVar7 = 0;
  if (0 < local_e0) {
    VVar7 = local_e0;
  }
  local_c0 = VVar7;
  while (bVar8 = VVar7 != 0, VVar7 = VVar7 + -1, bVar8) {
    local_f0 = std::uniform_int_distribution<long>::operator()
                         (&local_90,
                          (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)&e);
    sVar2 = local_e8->nbors[local_f0];
    plVar4 = std::__upper_bound<long*,long,__gnu_cxx::__ops::_Val_less_iter>
                       (local_e8->offsets,local_e8->offsets + local_b8,&local_f0);
    lVar6 = (long)plVar4 - (long)local_e8->offsets >> 3;
    sVar1 = lVar6 - 1;
    sVar5 = Escape::CGraph::getEdgeBinary(local_e8,sVar1,sVar2);
    if (sVar5 != local_f0) {
      puts("Bug in the code!! Run!!!! \n");
    }
    pEVar3 = local_e8->offsets;
    local_b0.degree = pEVar3[sVar2 + 1] - pEVar3[sVar2];
    lVar6 = pEVar3[lVar6] - pEVar3[lVar6 + -1];
    local_b0.u = sVar2;
    local_b0.v = sVar1;
    if ((lVar6 <= local_b0.degree) && ((local_b0.degree != lVar6 || ((long)sVar1 <= (long)sVar2))))
    {
      local_b0.degree = lVar6;
      local_b0.u = sVar1;
      local_b0.v = sVar2;
    }
    local_b0.index = local_f0;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::emplace_back<OrderedEdge>
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&local_d8,&local_b0);
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_58,local_f0);
    *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_80,sVar1);
    *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_80,sVar2);
    *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
  }
  __return_storage_ptr__->no_of_edges = local_e0;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            (&__return_storage_ptr__->edge_list,
             (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&local_d8);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_edge_set,
             (vector<bool,_std::allocator<bool>_> *)&local_58);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_vertex_set,
             (vector<bool,_std::allocator<bool>_> *)&local_80);
  __return_storage_ptr__->no_of_query = local_c0;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_80);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  std::_Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>::~_Vector_base(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

OrderedEdgeCollection GetEdgesByUniSampling(CGraph *cg, const Parameters &params, std::mt19937 mt) {
    /**
      * Setting of various input parameters for executing the algorithm
    */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges;
    VertexIdx seed_count = params.seed_count;
    EdgeIdx walk_length = params.walk_length;

    /**
     * Data structures for book-keeping and local variables
    */
    std::vector<OrderedEdge> edge_list;
    std::vector<bool> visited_edge_set (m,false);
    std::vector<bool> visited_vertex_set (n,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    VertexIdx src = 0, dst = 0;
    EdgeIdx nEdges = 0;
    /**
       * Set up random number generator
    */
    std::uniform_int_distribution<EdgeIdx> unif_rand_edge(0, m - 1);

    /**
     * Sample uniform random edges and store them in the structure
     */
    for (EdgeIdx i = 0; i < walk_length ; i++) {
        EdgeIdx e = unif_rand_edge(mt);
        dst = cg->nbors[e];
        no_of_query++; // One query to the uniform random neighbor oracle
        // binary search the array cg->offset to find the index v, such that edges[e] lies between cg->offset[v]
        // and cg->offset[v+1]. We achieve this by calling std::upper_bound
        src = std::upper_bound (cg->offsets, cg->offsets+n, e) - cg->offsets -1;

        // sanity check: the edge {src,dst} must have index edges[e].
        if (cg->getEdgeBinary(src,dst) != e)
            printf("Bug in the code!! Run!!!! \n\n");

        /**
          * Update the edge collection data structure with relevant information about the edge
         */
        VertexIdx u, v, low_deg;
        if (cg->degree(dst) < cg->degree(src) || (cg->degree(dst) == cg->degree(src) && dst < src)) {
            u = dst;
            v = src;
            low_deg = cg->degree(dst);
        } else {
            u = src;
            v = dst;
            low_deg = cg->degree(src);
        }
        edge_list.push_back(OrderedEdge{u, v, e, low_deg});

        /**
         * Update the book-keeping data structure with the visited edge and vertices
         */
        visited_edge_set[e] = true;
        visited_vertex_set[src] = true;
        visited_vertex_set[dst] = true;
    }

    OrderedEdgeCollection returnEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set, no_of_query};
    return returnEdgeCollection;
}